

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O0

Mio_Pin_t * Mio_LibraryReadPin(char **ppToken,int fExtendedFormat)

{
  int iVar1;
  Mio_Pin_t *pPin_00;
  char *pcVar2;
  double dVar3;
  char *local_30;
  char *pToken;
  Mio_Pin_t *pPin;
  int fExtendedFormat_local;
  char **ppToken_local;
  
  pPin_00 = (Mio_Pin_t *)calloc(1,0x50);
  pcVar2 = strtok((char *)0x0," \t\r\n");
  pcVar2 = Abc_UtilStrsav(pcVar2);
  pPin_00->pName = pcVar2;
  pcVar2 = strtok((char *)0x0," \t\r\n");
  iVar1 = strcmp(pcVar2,"UNKNOWN");
  if (iVar1 == 0) {
    pPin_00->Phase = MIO_PHASE_UNKNOWN;
  }
  else {
    iVar1 = strcmp(pcVar2,"INV");
    if (iVar1 == 0) {
      pPin_00->Phase = MIO_PHASE_INV;
    }
    else {
      iVar1 = strcmp(pcVar2,"NONINV");
      if (iVar1 != 0) {
        printf("Cannot read pin phase specification\n");
        Mio_PinDelete(pPin_00);
        *ppToken = pcVar2;
        return (Mio_Pin_t *)0x0;
      }
      pPin_00->Phase = MIO_PHASE_NONINV;
    }
  }
  pcVar2 = strtok((char *)0x0," \t\r\n");
  dVar3 = atof(pcVar2);
  pPin_00->dLoadInput = dVar3;
  pcVar2 = strtok((char *)0x0," \t\r\n");
  dVar3 = atof(pcVar2);
  pPin_00->dLoadMax = dVar3;
  pcVar2 = strtok((char *)0x0," \t\r\n");
  dVar3 = atof(pcVar2);
  pPin_00->dDelayBlockRise = dVar3;
  pcVar2 = strtok((char *)0x0," \t\r\n");
  dVar3 = atof(pcVar2);
  pPin_00->dDelayFanoutRise = dVar3;
  pcVar2 = strtok((char *)0x0," \t\r\n");
  dVar3 = atof(pcVar2);
  pPin_00->dDelayBlockFall = dVar3;
  local_30 = strtok((char *)0x0," \t\r\n");
  dVar3 = atof(local_30);
  pPin_00->dDelayFanoutFall = dVar3;
  if (fExtendedFormat != 0) {
    pPin_00->dDelayBlockFall = pPin_00->dDelayFanoutFall;
    pcVar2 = strtok((char *)0x0," \t");
    dVar3 = atof(pcVar2);
    pPin_00->dDelayFanoutFall = dVar3;
    local_30 = strtok((char *)0x0," \t\r\n");
  }
  if (pPin_00->dDelayBlockRise < pPin_00->dDelayBlockFall ||
      pPin_00->dDelayBlockRise == pPin_00->dDelayBlockFall) {
    pPin_00->dDelayBlockMax = pPin_00->dDelayBlockFall;
  }
  else {
    pPin_00->dDelayBlockMax = pPin_00->dDelayBlockRise;
  }
  *ppToken = local_30;
  return pPin_00;
}

Assistant:

Mio_Pin_t * Mio_LibraryReadPin( char ** ppToken, int fExtendedFormat )
{
    Mio_Pin_t * pPin;
    char * pToken = *ppToken;

    // allocate the gate structure
    pPin = ABC_CALLOC( Mio_Pin_t, 1 );

    // read the name
    pToken = strtok( NULL, " \t\r\n" );
    pPin->pName = Abc_UtilStrsav( pToken );

    // read the pin phase
    pToken = strtok( NULL, " \t\r\n" );
    if ( strcmp( pToken, MIO_STRING_UNKNOWN ) == 0 )
        pPin->Phase = MIO_PHASE_UNKNOWN;
    else if ( strcmp( pToken, MIO_STRING_INV ) == 0 )
        pPin->Phase = MIO_PHASE_INV;
    else if ( strcmp( pToken, MIO_STRING_NONINV ) == 0 )
        pPin->Phase = MIO_PHASE_NONINV;
    else 
    {
        printf( "Cannot read pin phase specification\n" );
        Mio_PinDelete( pPin );
        *ppToken = pToken;
        return NULL;
    }

    pToken = strtok( NULL, " \t\r\n" );
    pPin->dLoadInput = atof( pToken );

    pToken = strtok( NULL, " \t\r\n" );
    pPin->dLoadMax = atof( pToken );

    pToken = strtok( NULL, " \t\r\n" );
    pPin->dDelayBlockRise = atof( pToken );

    pToken = strtok( NULL, " \t\r\n" );
    pPin->dDelayFanoutRise = atof( pToken );

    pToken = strtok( NULL, " \t\r\n" );
    pPin->dDelayBlockFall = atof( pToken );

    pToken = strtok( NULL, " \t\r\n" );
    pPin->dDelayFanoutFall = atof( pToken );

    if ( fExtendedFormat )
    {
        /* In extended format, the field after dDelayFanoutRise
         * is to be ignored
         **/

        pPin->dDelayBlockFall  = pPin->dDelayFanoutFall;

        pToken = strtok( NULL, " \t" );
        pPin->dDelayFanoutFall = atof( pToken );

        /* last field is ignored */
        pToken = strtok( NULL, " \t\r\n" );
    }

    if ( pPin->dDelayBlockRise > pPin->dDelayBlockFall )
        pPin->dDelayBlockMax = pPin->dDelayBlockRise;
    else
        pPin->dDelayBlockMax = pPin->dDelayBlockFall;

    *ppToken = pToken;
    return pPin;
}